

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O3

void __thiscall
string_concatenation_Test::~string_concatenation_Test(string_concatenation_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(string, concatenation)
{
    // If this changes, this test may need to be updated to match
    ASSERT_EQ(16, ST_MAX_SSO_LENGTH);

    ST::string expected_short = "xxxxyyy";
    ST::string input1 = "xxxx";
    ST::string input2 = "yyy";

    ST::string expected_med = "xxxxxxxxxxyyyyyyyyy";
    ST::string input3 = "xxxxxxxxxx";
    ST::string input4 = "yyyyyyyyy";

    ST::string expected_long = "xxxxxxxxxxxxxxxyyyyyyyyyyyyyyyy";
    ST::string expected_long2 = "yyyyyyyyyyyyyyyyxxxxxxxxxxxxxxx";
    ST::string input5 = "xxxxxxxxxxxxxxx";
    ST::string input6 = "yyyyyyyyyyyyyyyy";

    // ST::string + ST::string
    EXPECT_EQ(expected_short, input1 + input2);
    EXPECT_EQ(expected_med, input3 + input4);
    EXPECT_EQ(expected_long, input5 + input6);
    EXPECT_EQ(expected_long2, input6 + input5);
    EXPECT_EQ(input1, input1 + ST::string());
    EXPECT_EQ(input1, ST::string() + input1);
    EXPECT_EQ(input6, input6 + ST::string());
    EXPECT_EQ(input6, ST::string() + input6);

    // ST::string + const char*
    EXPECT_EQ(expected_short, input1 + input2.c_str());
    EXPECT_EQ(expected_short, input1.c_str() + input2);
    EXPECT_EQ(expected_med, input3 + input4.c_str());
    EXPECT_EQ(expected_med, input3.c_str() + input4);
    EXPECT_EQ(expected_long, input5 + input6.c_str());
    EXPECT_EQ(expected_long, input5.c_str() + input6);
    EXPECT_EQ(expected_long2, input6 + input5.c_str());
    EXPECT_EQ(expected_long2, input6.c_str() + input5);
    EXPECT_EQ(input1, input1 + "");
    EXPECT_EQ(input1, "" + input1);
    EXPECT_EQ(input6, input6 + "");
    EXPECT_EQ(input6, "" + input6);
}